

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O2

void floaxie::grisu2<_19,_16,float,char>(float v,char *buffer,int *length,int *K)

{
  undefined1 auVar1 [16];
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  pVar2;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  pVar3;
  mantissa_storage_type mVar4;
  uint uVar5;
  int k;
  double dVar6;
  pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
  local_50;
  int *local_40;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> local_38;
  
  local_40 = length;
  local_50 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::boundaries(v);
  if (local_50.second.m_e < -0x14) {
    dVar6 = 1.0;
  }
  else {
    dVar6 = 0.0;
  }
  k = (int)((double)-(local_50.second.m_e + 0x14) * 0.30102999566398114 + dVar6);
  local_38 = cached_power<float>(k);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator*=(&local_50.first,&local_38);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator*=(&local_50.second,&local_38);
  if (local_50.first.m_f == 0xffffffff) {
    auVar1._4_4_ = local_50.second.m_f;
    auVar1._8_4_ = local_50.second.m_e;
    auVar1._0_4_ = local_50.first.m_e + 1;
    auVar1._12_4_ = 0;
    local_50 = (pair<floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>,_floaxie::diy_fp<float,_floaxie::diy_fp_traits<float>_>_>
                )(auVar1 << 0x20);
    mVar4 = 0x80000000;
  }
  else {
    mVar4 = local_50.first.m_f + 1;
  }
  pVar2 = local_50;
  local_50.first.m_f = mVar4;
  pVar3 = local_50;
  local_50.second.m_f = pVar2.second.m_f;
  uVar5 = local_50.second.m_f;
  if (local_50.second.m_f < 2) {
    uVar5 = local_50.second.m_f * 2;
    local_50.second.m_e = pVar2.second.m_e;
    local_50._0_12_ = pVar3._0_12_;
    local_50.second.m_e = local_50.second.m_e + -1;
    pVar3 = local_50;
  }
  local_50 = pVar3;
  local_50.second.m_f = uVar5 - 1;
  *K = -k;
  digit_gen_select<false>::gen<float,char>(&local_50.second,&local_50.first,buffer,local_40,K);
  return;
}

Assistant:

inline void grisu2(FloatType v, CharType* buffer, int* length, int* K) noexcept
	{
		static_assert(alpha <= gamma - 3,
			"It's imposed that γ ⩾ α + 3, since otherwise it's not always possible to find a proper decimal cached power");

		std::pair<diy_fp<FloatType>, diy_fp<FloatType>>&& w(diy_fp<FloatType>::boundaries(v));
		diy_fp<FloatType> &w_m(w.first), &w_p(w.second);

		const int mk = k_comp_exp<alpha, gamma>(w_p.exponent());
		const diy_fp<FloatType>& c_mk(cached_power<FloatType>(mk));

		w_m *= c_mk;
		w_p *= c_mk;

		++w_m;
		--w_p;

		*K = -mk;

		digit_gen<alpha, gamma>(w_p, w_m, buffer, length, K);
	}